

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::Runner::testEnded(Runner *this,AssertionResult *result)

{
  size_t *psVar1;
  pointer ppSVar2;
  IReporter *pIVar3;
  pointer pAVar4;
  OfType OVar5;
  pointer ppSVar6;
  pointer pAVar7;
  AssertionResult local_e8;
  
  OVar5 = (result->m_resultData).resultType;
  if (OVar5 == Ok) {
    (this->m_totals).assertions.passed = (this->m_totals).assertions.passed + 1;
  }
  else {
    if (((OVar5 & FailureBit) != Ok) &&
       (((result->m_info).resultDisposition & SuppressFail) == Normal)) {
      psVar1 = &(this->m_totals).assertions.failed;
      *psVar1 = *psVar1 + 1;
      ppSVar2 = (this->m_scopedInfos).
                super__Vector_base<Catch::ScopedInfo_*,_std::allocator<Catch::ScopedInfo_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppSVar6 = (this->m_scopedInfos).
                     super__Vector_base<Catch::ScopedInfo_*,_std::allocator<Catch::ScopedInfo_*>_>.
                     _M_impl.super__Vector_impl_data._M_start; ppSVar6 != ppSVar2;
          ppSVar6 = ppSVar6 + 1) {
        pIVar3 = (this->m_reporter).m_p;
        ExpressionResultBuilder::buildResult
                  (&local_e8,(ExpressionResultBuilder *)*ppSVar6,&this->m_lastAssertionInfo);
        (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[0x10])(pIVar3,&local_e8);
        AssertionResult::~AssertionResult(&local_e8);
      }
      pAVar4 = (this->m_assertionResults).
               super__Vector_base<Catch::AssertionResult,_std::allocator<Catch::AssertionResult>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (pAVar7 = (this->m_assertionResults).
                    super__Vector_base<Catch::AssertionResult,_std::allocator<Catch::AssertionResult>_>
                    ._M_impl.super__Vector_impl_data._M_start; pAVar7 != pAVar4; pAVar7 = pAVar7 + 1
          ) {
        pIVar3 = (this->m_reporter).m_p;
        (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[0x10])(pIVar3,pAVar7);
      }
      std::vector<Catch::AssertionResult,_std::allocator<Catch::AssertionResult>_>::clear
                (&this->m_assertionResults);
      OVar5 = (result->m_resultData).resultType;
    }
    if (OVar5 == Info) {
      std::vector<Catch::AssertionResult,_std::allocator<Catch::AssertionResult>_>::push_back
                (&this->m_assertionResults,result);
      return;
    }
  }
  (*(((this->m_reporter).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[0x10])();
  return;
}

Assistant:

virtual void testEnded( const AssertionResult& result ) {
            if( result.getResultType() == ResultWas::Ok ) {
                m_totals.assertions.passed++;
            }
            else if( !result.isOk() ) {
                m_totals.assertions.failed++;

                {
                    std::vector<ScopedInfo*>::const_iterator it = m_scopedInfos.begin();
                    std::vector<ScopedInfo*>::const_iterator itEnd = m_scopedInfos.end();
                    for(; it != itEnd; ++it )
                        m_reporter->Result( (*it)->buildResult( m_lastAssertionInfo ) );
                }
                {
                    std::vector<AssertionResult>::const_iterator it = m_assertionResults.begin();
                    std::vector<AssertionResult>::const_iterator itEnd = m_assertionResults.end();
                    for(; it != itEnd; ++it )
                        m_reporter->Result( *it );
                }
                m_assertionResults.clear();
            }

            if( result.getResultType() == ResultWas::Info )
                m_assertionResults.push_back( result );
            else
                m_reporter->Result( result );
        }